

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

optional<std::shared_ptr<ExpressionStatementAstNode>_> * __thiscall
Parser::parseExpressionStatement
          (optional<std::shared_ptr<ExpressionStatementAstNode>_> *__return_storage_ptr__,
          Parser *this)

{
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> expr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  size_type __dnew;
  bool error;
  
  parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_70,this);
  __dnew._7_1_ = '\0';
  local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x33;
  expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ = local_48;
  expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ =
       std::__cxx11::string::_M_create
                 ((ulong *)&expr.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _M_engaged,(ulong)&local_38);
  local_48[0] = local_38;
  builtin_strncpy((char *)expr.
                          super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_,
                  "Expected a semicolon following expression statement",0x33);
  local_50._M_pi = local_38;
  *(char *)(expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ +
           (long)local_38) = '\0';
  expect((Parser *)local_80,(TokenType)this,(bool *)0x10,(string *)((long)&__dnew + 7));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
      expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ != local_48) {
    operator_delete((void *)expr.
                            super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                            _16_8_,(ulong)((long)&local_48[0]->_vptr__Sp_counted_base + 1));
  }
  if ((__dnew._7_1_ == '\0') &&
     (expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ != '\0')) {
    expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = false;
    expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._17_7_ = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<ExpressionStatementAstNode,std::allocator<ExpressionStatementAstNode>,std::shared_ptr<ExpressionAstNode>&>
              (&local_50,
               (ExpressionStatementAstNode **)
               &expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
               (allocator<ExpressionStatementAstNode> *)&local_38,
               (shared_ptr<ExpressionAstNode> *)local_70);
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<ExpressionStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<ExpressionStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
         super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<ExpressionStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<ExpressionStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_50._M_pi;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<ExpressionStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionStatementAstNode>_>._M_engaged = true;
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<ExpressionStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionStatementAstNode>_>._M_engaged = false;
  }
  if (expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ == '\x01')
  {
    expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ = 0;
    if (expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._M_value.
        super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<ExpressionStatementAstNode>>
Parser::parseExpressionStatement() noexcept {
  auto expr = this->parseExpression();
  bool error = false;
  this->expect(TokenType::SemiColon, error, "Expected a semicolon following expression statement");

  if (error || !expr) {
    return std::nullopt;
  }

  return std::make_shared<ExpressionStatementAstNode>(expr.value());
}